

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::Formatter::ToString<int,void>
          (string *__return_storage_ptr__,Formatter *this,int x)

{
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  AlphaNum local_40;
  
  strings::AlphaNum::AlphaNum(&local_40,(int)this);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_40,
                    (AlphaNum *)CONCAT44(extraout_var,extraout_EDX));
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(I x) {
    return StrCat(x);
  }